

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cg.c
# Opt level: O1

int cod_streq(char *str1,char *str2)

{
  uint uVar1;
  int iVar2;
  
  uVar1 = 0;
  if ((str1 != (char *)0x0 || str2 != (char *)0x0) &&
     (uVar1 = 1, str1 != (char *)0x0 && str2 != (char *)0x0)) {
    iVar2 = strcmp(str1,str2);
    uVar1 = (uint)(iVar2 != 0);
  }
  return uVar1;
}

Assistant:

static int
cod_streq(char *str1, char *str2)
{
    int ret;
    if ((str1 == NULL) && (str2 == NULL)) return 0;
    if ((str1 == NULL) || (str2 == NULL)) return 1;
    ret = (strcmp(str1, str2) != 0);
/*    printf("Comparing %s and %s, returning %d\n", str1, str2, ret);*/
    return ret;
}